

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiStyle::ImGuiStyle(ImGuiStyle *this)

{
  (this->FramePadding).x = 0.0;
  (this->FramePadding).y = 0.0;
  memset(this->Colors,0,0x2b0);
  this->Alpha = 1.0;
  (this->WindowPadding).x = 8.0;
  (this->WindowPadding).y = 8.0;
  (this->WindowMinSize).x = 32.0;
  (this->WindowMinSize).y = 32.0;
  this->WindowRounding = 9.0;
  this->WindowTitleAlign = 1;
  this->ChildWindowRounding = 0.0;
  (this->FramePadding).x = 4.0;
  *(undefined8 *)&(this->FramePadding).y = 0x40400000;
  (this->ItemSpacing).x = 8.0;
  (this->ItemSpacing).y = 4.0;
  (this->ItemInnerSpacing).x = 4.0;
  (this->ItemInnerSpacing).y = 4.0;
  (this->TouchExtraPadding).x = 0.0;
  (this->TouchExtraPadding).y = 0.0;
  this->IndentSpacing = 21.0;
  this->ColumnsMinSpacing = 6.0;
  this->ScrollbarSize = 16.0;
  this->ScrollbarRounding = 9.0;
  this->GrabMinSize = 10.0;
  this->GrabRounding = 0.0;
  (this->DisplayWindowPadding).x = 22.0;
  (this->DisplayWindowPadding).y = 22.0;
  (this->DisplaySafeAreaPadding).x = 4.0;
  (this->DisplaySafeAreaPadding).y = 4.0;
  this->AntiAliasedLines = true;
  this->AntiAliasedShapes = true;
  this->CurveTessellationTol = 1.25;
  this->Colors[0].x = 0.9;
  this->Colors[0].y = 0.9;
  this->Colors[0].z = 0.9;
  *(undefined8 *)&this->Colors[0].w = 0x3f19999a3f800000;
  this->Colors[1].y = 0.6;
  this->Colors[1].z = 0.6;
  *(undefined8 *)&this->Colors[1].w = 0x3f800000;
  this->Colors[2].y = 0.0;
  this->Colors[2].z = 0.0;
  this->Colors[2].w = 0.7;
  this->Colors[3].x = 0.0;
  this->Colors[3].y = 0.0;
  this->Colors[3].z = 0.0;
  this->Colors[3].w = 0.0;
  this->Colors[4].x = 0.05;
  this->Colors[4].y = 0.05;
  this->Colors[4].z = 0.1;
  this->Colors[4].w = 0.9;
  this->Colors[5].x = 0.7;
  this->Colors[5].y = 0.7;
  this->Colors[5].z = 0.7;
  this->Colors[5].w = 0.65;
  this->Colors[6].x = 0.0;
  this->Colors[6].y = 0.0;
  this->Colors[6].z = 0.0;
  this->Colors[6].w = 0.0;
  this->Colors[7].x = 0.8;
  this->Colors[7].y = 0.8;
  this->Colors[7].z = 0.8;
  this->Colors[7].w = 0.3;
  this->Colors[8].x = 0.9;
  this->Colors[8].y = 0.8;
  this->Colors[8].z = 0.8;
  this->Colors[8].w = 0.4;
  this->Colors[9].x = 0.9;
  this->Colors[9].y = 0.65;
  this->Colors[9].z = 0.65;
  this->Colors[9].w = 0.45;
  this->Colors[10].x = 0.27;
  this->Colors[10].y = 0.27;
  this->Colors[10].z = 0.54;
  this->Colors[10].w = 0.83;
  this->Colors[0xb].x = 0.4;
  this->Colors[0xb].y = 0.4;
  this->Colors[0xb].z = 0.8;
  this->Colors[0xb].w = 0.2;
  this->Colors[0xc].x = 0.32;
  this->Colors[0xc].y = 0.32;
  this->Colors[0xc].z = 0.63;
  this->Colors[0xc].w = 0.87;
  this->Colors[0xd].x = 0.4;
  this->Colors[0xd].y = 0.4;
  this->Colors[0xd].z = 0.55;
  this->Colors[0xd].w = 0.8;
  this->Colors[0xe].x = 0.2;
  this->Colors[0xe].y = 0.25;
  this->Colors[0xe].z = 0.3;
  this->Colors[0xe].w = 0.6;
  this->Colors[0xf].x = 0.4;
  this->Colors[0xf].y = 0.4;
  this->Colors[0xf].z = 0.8;
  this->Colors[0xf].w = 0.3;
  this->Colors[0x10].x = 0.4;
  this->Colors[0x10].y = 0.4;
  this->Colors[0x10].z = 0.8;
  this->Colors[0x10].w = 0.4;
  this->Colors[0x11].x = 0.8;
  this->Colors[0x11].y = 0.5;
  this->Colors[0x11].z = 0.5;
  this->Colors[0x11].w = 0.4;
  this->Colors[0x12].x = 0.2;
  this->Colors[0x12].y = 0.2;
  this->Colors[0x12].z = 0.2;
  this->Colors[0x12].w = 0.99;
  *(undefined8 *)(this->Colors + 0x13) = 0x3f6666663f666666;
  this->Colors[0x13].z = 0.9;
  this->Colors[0x13].w = 0.5;
  this->Colors[0x14].x = 1.0;
  this->Colors[0x14].y = 1.0;
  this->Colors[0x14].z = 1.0;
  this->Colors[0x14].w = 0.3;
  this->Colors[0x15].x = 0.8;
  this->Colors[0x15].y = 0.5;
  this->Colors[0x15].z = 0.5;
  this->Colors[0x15].w = 1.0;
  this->Colors[0x16].x = 0.67;
  this->Colors[0x16].y = 0.4;
  this->Colors[0x16].z = 0.4;
  this->Colors[0x16].w = 0.6;
  this->Colors[0x17].x = 0.67;
  this->Colors[0x17].y = 0.4;
  this->Colors[0x17].z = 0.4;
  this->Colors[0x17].w = 1.0;
  this->Colors[0x18].x = 0.8;
  this->Colors[0x18].y = 0.5;
  this->Colors[0x18].z = 0.5;
  this->Colors[0x18].w = 1.0;
  this->Colors[0x19].x = 0.4;
  this->Colors[0x19].y = 0.4;
  this->Colors[0x19].z = 0.9;
  this->Colors[0x19].w = 0.45;
  this->Colors[0x1a].x = 0.45;
  this->Colors[0x1a].y = 0.45;
  this->Colors[0x1a].z = 0.9;
  this->Colors[0x1a].w = 0.8;
  this->Colors[0x1b].x = 0.53;
  this->Colors[0x1b].y = 0.53;
  this->Colors[0x1b].z = 0.87;
  this->Colors[0x1b].w = 0.8;
  this->Colors[0x1c].x = 0.5;
  this->Colors[0x1c].y = 0.5;
  this->Colors[0x1c].z = 0.5;
  this->Colors[0x1c].w = 1.0;
  this->Colors[0x1d].x = 0.7;
  this->Colors[0x1d].y = 0.6;
  this->Colors[0x1d].z = 0.6;
  this->Colors[0x1d].w = 1.0;
  *(undefined8 *)(this->Colors + 0x1e) = 0x3f3333333f666666;
  this->Colors[0x1e].z = 0.7;
  this->Colors[0x1e].w = 1.0;
  this->Colors[0x1f].x = 1.0;
  this->Colors[0x1f].y = 1.0;
  this->Colors[0x1f].z = 1.0;
  this->Colors[0x1f].w = 0.3;
  this->Colors[0x20].x = 1.0;
  this->Colors[0x20].y = 1.0;
  this->Colors[0x20].z = 1.0;
  this->Colors[0x20].w = 0.6;
  this->Colors[0x21].x = 1.0;
  this->Colors[0x21].y = 1.0;
  this->Colors[0x21].z = 1.0;
  this->Colors[0x21].w = 0.9;
  this->Colors[0x22].x = 0.5;
  this->Colors[0x22].y = 0.5;
  this->Colors[0x22].z = 0.9;
  this->Colors[0x22].w = 0.5;
  this->Colors[0x23].x = 0.7;
  this->Colors[0x23].y = 0.7;
  this->Colors[0x23].z = 0.9;
  this->Colors[0x23].w = 0.6;
  *(undefined8 *)(this->Colors + 0x24) = 0x3f3333333f333333;
  this->Colors[0x24].z = 0.7;
  this->Colors[0x24].w = 1.0;
  this->Colors[0x25].x = 1.0;
  this->Colors[0x25].y = 1.0;
  this->Colors[0x25].z = 1.0;
  this->Colors[0x25].w = 1.0;
  *(undefined8 *)(this->Colors + 0x26) = 0x3f3333333f666666;
  this->Colors[0x26].z = 0.0;
  this->Colors[0x26].w = 1.0;
  *(undefined8 *)(this->Colors + 0x27) = 0x3f3333333f666666;
  this->Colors[0x27].z = 0.0;
  this->Colors[0x27].w = 1.0;
  this->Colors[0x28].x = 1.0;
  this->Colors[0x28].y = 0.6;
  this->Colors[0x28].z = 0.0;
  this->Colors[0x28].w = 1.0;
  this->Colors[0x29].x = 0.0;
  this->Colors[0x29].y = 0.0;
  this->Colors[0x29].z = 1.0;
  this->Colors[0x29].w = 0.35;
  this->Colors[0x2a].x = 0.2;
  this->Colors[0x2a].y = 0.2;
  this->Colors[0x2a].z = 0.2;
  this->Colors[0x2a].w = 0.35;
  return;
}

Assistant:

ImGuiStyle::ImGuiStyle()
{
    Alpha                   = 1.0f;             // Global alpha applies to everything in ImGui
    WindowPadding           = ImVec2(8,8);      // Padding within a window
    WindowMinSize           = ImVec2(32,32);    // Minimum window size
    WindowRounding          = 9.0f;             // Radius of window corners rounding. Set to 0.0f to have rectangular windows
    WindowTitleAlign        = ImGuiAlign_Left;  // Alignment for title bar text
    ChildWindowRounding     = 0.0f;             // Radius of child window corners rounding. Set to 0.0f to have rectangular child windows
    FramePadding            = ImVec2(4,3);      // Padding within a framed rectangle (used by most widgets)
    FrameRounding           = 0.0f;             // Radius of frame corners rounding. Set to 0.0f to have rectangular frames (used by most widgets).
    ItemSpacing             = ImVec2(8,4);      // Horizontal and vertical spacing between widgets/lines
    ItemInnerSpacing        = ImVec2(4,4);      // Horizontal and vertical spacing between within elements of a composed widget (e.g. a slider and its label)
    TouchExtraPadding       = ImVec2(0,0);      // Expand reactive bounding box for touch-based system where touch position is not accurate enough. Unfortunately we don't sort widgets so priority on overlap will always be given to the first widget. So don't grow this too much!
    IndentSpacing           = 21.0f;            // Horizontal spacing when e.g. entering a tree node. Generally == (FontSize + FramePadding.x*2).
    ColumnsMinSpacing       = 6.0f;             // Minimum horizontal spacing between two columns
    ScrollbarSize           = 16.0f;            // Width of the vertical scrollbar, Height of the horizontal scrollbar
    ScrollbarRounding       = 9.0f;             // Radius of grab corners rounding for scrollbar
    GrabMinSize             = 10.0f;            // Minimum width/height of a grab box for slider/scrollbar
    GrabRounding            = 0.0f;             // Radius of grabs corners rounding. Set to 0.0f to have rectangular slider grabs.
    DisplayWindowPadding    = ImVec2(22,22);    // Window positions are clamped to be visible within the display area by at least this amount. Only covers regular windows.
    DisplaySafeAreaPadding  = ImVec2(4,4);      // If you cannot see the edge of your screen (e.g. on a TV) increase the safe area padding. Covers popups/tooltips as well regular windows.
    AntiAliasedLines        = true;             // Enable anti-aliasing on lines/borders. Disable if you are really short on CPU/GPU.
    AntiAliasedShapes       = true;             // Enable anti-aliasing on filled shapes (rounded rectangles, circles, etc.)
    CurveTessellationTol    = 1.25f;            // Tessellation tolerance. Decrease for highly tessellated curves (higher quality, more polygons), increase to reduce quality.

    Colors[ImGuiCol_Text]                   = ImVec4(0.90f, 0.90f, 0.90f, 1.00f);
    Colors[ImGuiCol_TextDisabled]           = ImVec4(0.60f, 0.60f, 0.60f, 1.00f);
    Colors[ImGuiCol_WindowBg]               = ImVec4(0.00f, 0.00f, 0.00f, 0.70f);
    Colors[ImGuiCol_ChildWindowBg]          = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    Colors[ImGuiCol_PopupBg]                = ImVec4(0.05f, 0.05f, 0.10f, 0.90f);
    Colors[ImGuiCol_Border]                 = ImVec4(0.70f, 0.70f, 0.70f, 0.65f);
    Colors[ImGuiCol_BorderShadow]           = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    Colors[ImGuiCol_FrameBg]                = ImVec4(0.80f, 0.80f, 0.80f, 0.30f);   // Background of checkbox, radio button, plot, slider, text input
    Colors[ImGuiCol_FrameBgHovered]         = ImVec4(0.90f, 0.80f, 0.80f, 0.40f);
    Colors[ImGuiCol_FrameBgActive]          = ImVec4(0.90f, 0.65f, 0.65f, 0.45f);
    Colors[ImGuiCol_TitleBg]                = ImVec4(0.27f, 0.27f, 0.54f, 0.83f);
    Colors[ImGuiCol_TitleBgCollapsed]       = ImVec4(0.40f, 0.40f, 0.80f, 0.20f);
    Colors[ImGuiCol_TitleBgActive]          = ImVec4(0.32f, 0.32f, 0.63f, 0.87f);
    Colors[ImGuiCol_MenuBarBg]              = ImVec4(0.40f, 0.40f, 0.55f, 0.80f);
    Colors[ImGuiCol_ScrollbarBg]            = ImVec4(0.20f, 0.25f, 0.30f, 0.60f);
    Colors[ImGuiCol_ScrollbarGrab]          = ImVec4(0.40f, 0.40f, 0.80f, 0.30f);
    Colors[ImGuiCol_ScrollbarGrabHovered]   = ImVec4(0.40f, 0.40f, 0.80f, 0.40f);
    Colors[ImGuiCol_ScrollbarGrabActive]    = ImVec4(0.80f, 0.50f, 0.50f, 0.40f);
    Colors[ImGuiCol_ComboBg]                = ImVec4(0.20f, 0.20f, 0.20f, 0.99f);
    Colors[ImGuiCol_CheckMark]              = ImVec4(0.90f, 0.90f, 0.90f, 0.50f);
    Colors[ImGuiCol_SliderGrab]             = ImVec4(1.00f, 1.00f, 1.00f, 0.30f);
    Colors[ImGuiCol_SliderGrabActive]       = ImVec4(0.80f, 0.50f, 0.50f, 1.00f);
    Colors[ImGuiCol_Button]                 = ImVec4(0.67f, 0.40f, 0.40f, 0.60f);
    Colors[ImGuiCol_ButtonHovered]          = ImVec4(0.67f, 0.40f, 0.40f, 1.00f);
    Colors[ImGuiCol_ButtonActive]           = ImVec4(0.80f, 0.50f, 0.50f, 1.00f);
    Colors[ImGuiCol_Header]                 = ImVec4(0.40f, 0.40f, 0.90f, 0.45f);
    Colors[ImGuiCol_HeaderHovered]          = ImVec4(0.45f, 0.45f, 0.90f, 0.80f);
    Colors[ImGuiCol_HeaderActive]           = ImVec4(0.53f, 0.53f, 0.87f, 0.80f);
    Colors[ImGuiCol_Column]                 = ImVec4(0.50f, 0.50f, 0.50f, 1.00f);
    Colors[ImGuiCol_ColumnHovered]          = ImVec4(0.70f, 0.60f, 0.60f, 1.00f);
    Colors[ImGuiCol_ColumnActive]           = ImVec4(0.90f, 0.70f, 0.70f, 1.00f);
    Colors[ImGuiCol_ResizeGrip]             = ImVec4(1.00f, 1.00f, 1.00f, 0.30f);
    Colors[ImGuiCol_ResizeGripHovered]      = ImVec4(1.00f, 1.00f, 1.00f, 0.60f);
    Colors[ImGuiCol_ResizeGripActive]       = ImVec4(1.00f, 1.00f, 1.00f, 0.90f);
    Colors[ImGuiCol_CloseButton]            = ImVec4(0.50f, 0.50f, 0.90f, 0.50f);
    Colors[ImGuiCol_CloseButtonHovered]     = ImVec4(0.70f, 0.70f, 0.90f, 0.60f);
    Colors[ImGuiCol_CloseButtonActive]      = ImVec4(0.70f, 0.70f, 0.70f, 1.00f);
    Colors[ImGuiCol_PlotLines]              = ImVec4(1.00f, 1.00f, 1.00f, 1.00f);
    Colors[ImGuiCol_PlotLinesHovered]       = ImVec4(0.90f, 0.70f, 0.00f, 1.00f);
    Colors[ImGuiCol_PlotHistogram]          = ImVec4(0.90f, 0.70f, 0.00f, 1.00f);
    Colors[ImGuiCol_PlotHistogramHovered]   = ImVec4(1.00f, 0.60f, 0.00f, 1.00f);
    Colors[ImGuiCol_TextSelectedBg]         = ImVec4(0.00f, 0.00f, 1.00f, 0.35f);
    Colors[ImGuiCol_ModalWindowDarkening]   = ImVec4(0.20f, 0.20f, 0.20f, 0.35f);
}